

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_3_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  long lVar24;
  long lVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  
  lVar24 = (long)dstride;
  if (block_width == 8) {
    for (lVar25 = 0; lVar25 < block_height; lVar25 = lVar25 + 2) {
      uVar8 = *in;
      uVar9 = in[1];
      uVar10 = in[2];
      uVar11 = in[3];
      uVar12 = in[4];
      uVar13 = in[5];
      uVar14 = in[6];
      uVar15 = in[7];
      uVar16 = in[0x90];
      uVar17 = in[0x91];
      uVar18 = in[0x92];
      uVar19 = in[0x93];
      uVar20 = in[0x94];
      uVar21 = in[0x95];
      uVar22 = in[0x96];
      uVar23 = in[0x97];
      *(char *)dest =
           (0 < (short)uVar8) * ((short)uVar8 < 0x100) * (char)uVar8 - (0xff < (short)uVar8);
      *(char *)((long)dest + 1) =
           (0 < (short)uVar9) * ((short)uVar9 < 0x100) * (char)uVar9 - (0xff < (short)uVar9);
      *(char *)((long)dest + 2) =
           (0 < (short)uVar10) * ((short)uVar10 < 0x100) * (char)uVar10 - (0xff < (short)uVar10);
      *(char *)((long)dest + 3) =
           (0 < (short)uVar11) * ((short)uVar11 < 0x100) * (char)uVar11 - (0xff < (short)uVar11);
      *(char *)((long)dest + 4) =
           (0 < (short)uVar12) * ((short)uVar12 < 0x100) * (char)uVar12 - (0xff < (short)uVar12);
      *(char *)((long)dest + 5) =
           (0 < (short)uVar13) * ((short)uVar13 < 0x100) * (char)uVar13 - (0xff < (short)uVar13);
      *(char *)((long)dest + 6) =
           (0 < (short)uVar14) * ((short)uVar14 < 0x100) * (char)uVar14 - (0xff < (short)uVar14);
      *(char *)((long)dest + 7) =
           (0 < (short)uVar15) * ((short)uVar15 < 0x100) * (char)uVar15 - (0xff < (short)uVar15);
      *(char *)((long)dest + lVar24 + 8) =
           (0 < (short)uVar16) * ((short)uVar16 < 0x100) * (char)uVar16 - (0xff < (short)uVar16);
      *(char *)((long)dest + lVar24 + 9) =
           (0 < (short)uVar17) * ((short)uVar17 < 0x100) * (char)uVar17 - (0xff < (short)uVar17);
      *(char *)((long)dest + lVar24 + 10) =
           (0 < (short)uVar18) * ((short)uVar18 < 0x100) * (char)uVar18 - (0xff < (short)uVar18);
      *(char *)((long)dest + lVar24 + 0xb) =
           (0 < (short)uVar19) * ((short)uVar19 < 0x100) * (char)uVar19 - (0xff < (short)uVar19);
      *(char *)((long)dest + lVar24 + 0xc) =
           (0 < (short)uVar20) * ((short)uVar20 < 0x100) * (char)uVar20 - (0xff < (short)uVar20);
      *(char *)((long)dest + lVar24 + 0xd) =
           (0 < (short)uVar21) * ((short)uVar21 < 0x100) * (char)uVar21 - (0xff < (short)uVar21);
      *(char *)((long)dest + lVar24 + 0xe) =
           (0 < (short)uVar22) * ((short)uVar22 < 0x100) * (char)uVar22 - (0xff < (short)uVar22);
      *(char *)((long)dest + lVar24 + 0xf) =
           (0 < (short)uVar23) * ((short)uVar23 < 0x100) * (char)uVar23 - (0xff < (short)uVar23);
      in = in + 0x120;
      dest = (void *)((long)dest + lVar24 * 2);
    }
  }
  else {
    for (lVar25 = 0; lVar25 < block_height; lVar25 = lVar25 + 4) {
      uVar1 = *(undefined8 *)in;
      uVar2 = *(undefined8 *)(in + 0x90);
      sVar4 = (short)uVar2;
      sVar5 = (short)((ulong)uVar2 >> 0x10);
      sVar6 = (short)((ulong)uVar2 >> 0x20);
      sVar7 = (short)((ulong)uVar2 >> 0x30);
      uVar26 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)((ulong)uVar2 >> 0x30) -
                        (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * (char)((ulong)uVar2 >> 0x20) -
                                 (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) *
                                          (char)((ulong)uVar2 >> 0x10) - (0xff < sVar5),
                                          (0 < sVar4) * (sVar4 < 0x100) * (char)uVar2 -
                                          (0xff < sVar4))));
      sVar4 = (short)uVar1;
      sVar5 = (short)((ulong)uVar1 >> 0x10);
      sVar6 = (short)((ulong)uVar1 >> 0x20);
      sVar7 = (short)((ulong)uVar1 >> 0x30);
      uVar2 = *(undefined8 *)(in + 0x120);
      uVar3 = *(undefined8 *)(in + 0x1b0);
      *(int *)dest = (int)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((ulong)uVar1 >> 0x30) -
                                    (0xff < sVar7),
                                    CONCAT16((0 < sVar6) * (sVar6 < 0x100) *
                                             (char)((ulong)uVar1 >> 0x20) - (0xff < sVar6),
                                             CONCAT15((0 < sVar5) * (sVar5 < 0x100) *
                                                      (char)((ulong)uVar1 >> 0x10) - (0xff < sVar5),
                                                      CONCAT14((0 < sVar4) * (sVar4 < 0x100) *
                                                               (char)uVar1 - (0xff < sVar4),uVar26))
                                            )) >> 0x20);
      sVar4 = (short)uVar3;
      sVar5 = (short)((ulong)uVar3 >> 0x10);
      sVar6 = (short)((ulong)uVar3 >> 0x20);
      sVar7 = (short)((ulong)uVar3 >> 0x30);
      uVar27 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)((ulong)uVar3 >> 0x30) -
                        (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * (char)((ulong)uVar3 >> 0x20) -
                                 (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) *
                                          (char)((ulong)uVar3 >> 0x10) - (0xff < sVar5),
                                          (0 < sVar4) * (sVar4 < 0x100) * (char)uVar3 -
                                          (0xff < sVar4))));
      sVar4 = (short)uVar2;
      sVar5 = (short)((ulong)uVar2 >> 0x10);
      sVar6 = (short)((ulong)uVar2 >> 0x20);
      sVar7 = (short)((ulong)uVar2 >> 0x30);
      *(undefined4 *)((long)dest + lVar24) = uVar26;
      *(int *)((long)dest + lVar24 * 2) =
           (int)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((ulong)uVar2 >> 0x30) -
                          (0xff < sVar7),
                          CONCAT16((0 < sVar6) * (sVar6 < 0x100) * (char)((ulong)uVar2 >> 0x20) -
                                   (0xff < sVar6),
                                   CONCAT15((0 < sVar5) * (sVar5 < 0x100) *
                                            (char)((ulong)uVar2 >> 0x10) - (0xff < sVar5),
                                            CONCAT14((0 < sVar4) * (sVar4 < 0x100) * (char)uVar2 -
                                                     (0xff < sVar4),uVar27)))) >> 0x20);
      *(undefined4 *)((long)dest + lVar24 * 3) = uVar27;
      in = in + 0x240;
      dest = (void *)((long)dest + lVar24 * 4);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_3)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;

  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  }
}